

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O3

void __thiscall format::mtx_arith_error::~mtx_arith_error(mtx_arith_error *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  *(undefined ***)&this->super_mtx_error = &PTR__mtx_arith_error_00160710;
  pcVar2 = (this->got_arith_)._M_dataplus._M_p;
  paVar1 = &(this->got_arith_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->expected_arith_)._M_dataplus._M_p;
  paVar1 = &(this->expected_arith_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  *(undefined ***)&this->super_mtx_error = &PTR__mtx_error_001606e8;
  pcVar2 = (this->super_mtx_error).filename_._M_dataplus._M_p;
  paVar1 = &(this->super_mtx_error).filename_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::runtime_error::~runtime_error((runtime_error *)this);
  operator_delete(this,0x70);
  return;
}

Assistant:

mtx_arith_error
  (
    std::string expected_arith,
    std::string got_arith,
    std::string filename="Unknown",
    std::string msg="Matrix arithmetic mismatch"
  )
  : mtx_error(filename, msg)
  {
   expected_arith_ = expected_arith;
   got_arith_ = got_arith;
  }